

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.cpp
# Opt level: O0

string * getHomePath_abi_cxx11_(void)

{
  char *pcVar1;
  string *in_RDI;
  bool bVar2;
  char *path;
  char *drive;
  char *home;
  char *qghome;
  char *in_stack_ffffffffffffff30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  char *local_a8;
  undefined1 local_89 [39];
  byte local_62;
  allocator local_61;
  string local_60 [55];
  allocator local_29;
  char *local_28;
  char *local_20;
  char *local_18;
  char *local_10;
  
  local_a8 = getenv("QGREP_HOME");
  local_10 = local_a8;
  if (local_a8 == (char *)0x0) {
    local_a8 = getenv("HOME");
  }
  local_18 = local_a8;
  local_20 = getenv("HOMEDRIVE");
  local_28 = getenv("HOMEPATH");
  pcVar1 = local_18;
  if (((local_18 == (char *)0x0) && (local_20 == (char *)0x0)) && (local_28 == (char *)0x0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"",&local_29);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
  }
  else {
    local_62 = 0;
    bVar2 = local_18 == (char *)0x0;
    if (bVar2) {
      in_stack_ffffffffffffff38 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_89;
      in_stack_ffffffffffffff30 = local_20;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_89 + 1),in_stack_ffffffffffffff30,
                 (allocator *)in_stack_ffffffffffffff38);
      std::operator+(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    }
    else {
      std::allocator<char>::allocator();
      local_62 = 1;
      std::__cxx11::string::string(local_60,pcVar1,&local_61);
    }
    std::operator+(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    std::__cxx11::string::~string(local_60);
    if (bVar2) {
      std::__cxx11::string::~string((string *)(local_89 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_89);
    }
    if ((local_62 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_61);
    }
  }
  return in_RDI;
}

Assistant:

static std::string getHomePath()
{
    char* qghome = getenv("QGREP_HOME");
    char* home = qghome ? qghome : getenv("HOME");
	const char* drive = getenv("HOMEDRIVE");
	const char* path = getenv("HOMEPATH");

    if (!home && !drive && !path) return "";

	return (home ? std::string(home) : std::string(drive) + path) + "/.qgrep";
}